

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O3

unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> __thiscall
flow::lang::Parser::addExpr(Parser *this)

{
  Token token;
  _Base_ptr p_Var1;
  _Base_ptr this_00;
  ASTNode *pAVar2;
  Opcode op;
  LiteralType args;
  LiteralType args_2;
  _Head_base<0UL,_flow::lang::Expr_*,_false> this_01;
  _Base_ptr in_RSI;
  undefined8 uVar3;
  _Head_base<0UL,_flow::lang::Expr_*,_false> local_70;
  undefined1 local_68 [16];
  string local_58;
  _Head_base<0UL,_flow::lang::Lexer_*,_false> local_38;
  
  local_68._8_8_ = in_RSI;
  mulExpr((Parser *)&local_70);
  if ((BinaryExpr *)local_70._M_head_impl == (BinaryExpr *)0x0) {
    *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
  }
  else {
    uVar3 = *(undefined8 *)&(this->features_)._M_t._M_impl;
    do {
      token = ((Lexer *)((_Base_ptr)(local_68._8_8_ + 0x20))->_M_left)->token_;
      if (1 < token - Plus) {
        *(Expr **)&(this->features_)._M_t._M_impl = local_70._M_head_impl;
        return (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>)this;
      }
      Lexer::nextToken((Lexer *)((_Base_ptr)(local_68._8_8_ + 0x20))->_M_left);
      mulExpr((Parser *)local_68);
      if ((Expr *)local_68._0_8_ == (Expr *)0x0) {
        *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
        goto LAB_0012aaf1;
      }
      op = makeOperator(token,local_70._M_head_impl,(Expr *)local_68._0_8_);
      if (op == EXIT) {
        p_Var1 = ((_Base_ptr)(local_68._8_8_ + 0x20))->_M_left;
        this_00 = ((_Base_ptr)(local_68._8_8_ + 0x60))->_M_parent;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_38._M_head_impl = (Lexer *)0x33;
        local_58._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
        local_58.field_2._M_allocated_capacity = (size_type)local_38._M_head_impl;
        *(undefined8 *)((long)local_58._M_dataplus._M_p + 0x20) = 0x2073646e61726570;
        ((_Base_ptr)((long)local_58._M_dataplus._M_p + 0x20))->_M_parent =
             (_Base_ptr)0x7b207d7b207d7b28;
        ((_Base_ptr)local_58._M_dataplus._M_p)->_M_left = (_Base_ptr)0x7270786520797261;
        ((_Base_ptr)local_58._M_dataplus._M_p)->_M_right = (_Base_ptr)0x6f206e6f69737365;
        ((_Base_ptr)local_58._M_dataplus._M_p)->_M_color = 0x6f636e49;
        ((_Base_ptr)local_58._M_dataplus._M_p)->field_0x4 = 'm';
        ((_Base_ptr)local_58._M_dataplus._M_p)->field_0x5 = 'p';
        ((_Base_ptr)local_58._M_dataplus._M_p)->field_0x6 = 'a';
        ((_Base_ptr)local_58._M_dataplus._M_p)->field_0x7 = 't';
        *(undefined4 *)&((_Base_ptr)local_58._M_dataplus._M_p)->_M_parent = 0x656c6269;
        builtin_strncpy((char *)((long)&((_Base_ptr)local_58._M_dataplus._M_p)->_M_parent + 4),
                        " bin",4);
        *(undefined4 *)((long)&((_Base_ptr)((long)local_58._M_dataplus._M_p + 0x20))->_M_parent + 7)
             = 0x2e297d7b;
        local_58._M_string_length = (size_type)local_38._M_head_impl;
        *(undefined1 *)
         ((long)&(((list_type *)&(local_38._M_head_impl)->report_)->
                 super__Vector_base<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start +
         (long)&((_Base_ptr)local_58._M_dataplus._M_p)->_M_color) = 0;
        args = (*((ASTNode *)&((local_70._M_head_impl)->super_ASTNode)._vptr_ASTNode)->_vptr_ASTNode
                 [3])();
        args_2 = (**(code **)(*(long *)local_68._0_8_ + 0x18))();
        diagnostics::Report::typeError<flow::LiteralType,flow::lang::Token,flow::LiteralType>
                  ((Report *)this_00,(SourceLocation *)&p_Var1[1]._M_left,&local_58,args,token,
                   args_2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          (ulong)(local_58.field_2._M_allocated_capacity + 1));
        }
        uVar3 = 0;
        this_01._M_head_impl = local_70._M_head_impl;
      }
      else {
        this_01._M_head_impl = (Expr *)operator_new(0x58);
        BinaryExpr::BinaryExpr
                  ((BinaryExpr *)this_01._M_head_impl,op,
                   (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_70
                   ,(unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_68
                  );
        if ((BinaryExpr *)local_70._M_head_impl != (BinaryExpr *)0x0) {
          pAVar2 = &(local_70._M_head_impl)->super_ASTNode;
          local_70._M_head_impl = this_01._M_head_impl;
          (*((ASTNode *)&pAVar2->_vptr_ASTNode)->_vptr_ASTNode[1])();
          this_01._M_head_impl = local_70._M_head_impl;
        }
      }
      local_70._M_head_impl = this_01._M_head_impl;
      if ((Expr *)local_68._0_8_ != (Expr *)0x0) {
        (**(code **)(*(long *)local_68._0_8_ + 8))();
      }
    } while (op != EXIT);
    *(undefined8 *)&(this->features_)._M_t._M_impl = uVar3;
LAB_0012aaf1:
    if ((BinaryExpr *)local_70._M_head_impl != (BinaryExpr *)0x0) {
      (*((ASTNode *)&((local_70._M_head_impl)->super_ASTNode)._vptr_ASTNode)->_vptr_ASTNode[1])();
    }
  }
  return (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::addExpr() {
  std::unique_ptr<Expr> lhs = mulExpr();
  if (!lhs) return nullptr;

  for (;;) {
    switch (token()) {
      case Token::Plus:
      case Token::Minus: {
        Token binop = token();
        nextToken();

        std::unique_ptr<Expr> rhs = mulExpr();
        if (!rhs) return nullptr;

        Opcode opc = makeOperator(binop, lhs.get(), rhs.get());
        if (opc == Opcode::EXIT) {
          report_.typeError(
              lastLocation(),
              "Incompatible binary expression operands ({} {} {}).",
              lhs->getType(), binop, rhs->getType());
          return nullptr;
        }

        lhs = std::make_unique<BinaryExpr>(opc, std::move(lhs), std::move(rhs));
        break;
      }
      default:
        return lhs;
    }
  }
}